

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::objectQuerySingleInternal::cbtCompoundLeafCallback::ProcessChild
          (cbtCompoundLeafCallback *this,int index,cbtTransform *childTrans,
          cbtCollisionShape *childCollisionShape)

{
  float fVar1;
  cbtScalar cVar2;
  float fVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  float fVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  float fVar11;
  cbtScalar cVar12;
  cbtScalar cVar13;
  cbtScalar cVar14;
  cbtScalar cVar15;
  cbtScalar cVar16;
  cbtScalar cVar17;
  cbtTransform *pcVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  cbtCollisionObjectWrapper tmpObj;
  LocalInfoAdder my_cb;
  cbtTransform childWorldTrans;
  cbtCollisionObjectWrapper local_90;
  ConvexResultCallback local_68;
  ConvexResultCallback *local_50;
  int local_48;
  cbtTransform local_40;
  
  pcVar18 = this->m_colObjWorldTransform;
  fVar1 = (childTrans->m_basis).m_el[1].m_floats[0];
  cVar2 = (pcVar18->m_basis).m_el[0].m_floats[0];
  fVar3 = (pcVar18->m_basis).m_el[0].m_floats[1];
  cVar4 = (childTrans->m_basis).m_el[0].m_floats[0];
  cVar5 = (childTrans->m_basis).m_el[0].m_floats[1];
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar3)),ZEXT416((uint)cVar4),ZEXT416((uint)cVar2)
                           );
  cVar6 = (childTrans->m_basis).m_el[2].m_floats[0];
  cVar7 = (pcVar18->m_basis).m_el[0].m_floats[2];
  auVar19 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar6),ZEXT416((uint)cVar7));
  fVar8 = (childTrans->m_basis).m_el[1].m_floats[1];
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar3)),ZEXT416((uint)cVar5),ZEXT416((uint)cVar2)
                           );
  cVar9 = (childTrans->m_basis).m_el[2].m_floats[1];
  auVar20 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar9),ZEXT416((uint)cVar7));
  cVar10 = (childTrans->m_basis).m_el[0].m_floats[2];
  fVar11 = (childTrans->m_basis).m_el[1].m_floats[2];
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar3)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)cVar2));
  cVar12 = (childTrans->m_basis).m_el[2].m_floats[2];
  auVar21 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar12),ZEXT416((uint)cVar7));
  cVar13 = (pcVar18->m_basis).m_el[1].m_floats[0];
  cVar14 = (pcVar18->m_basis).m_el[1].m_floats[1];
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)cVar14));
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar4),ZEXT416((uint)cVar13));
  cVar15 = (pcVar18->m_basis).m_el[1].m_floats[2];
  auVar26 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar6),ZEXT416((uint)cVar15));
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)cVar14));
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar5),ZEXT416((uint)cVar13));
  auVar27 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar9),ZEXT416((uint)cVar15));
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)cVar14));
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar10),ZEXT416((uint)cVar13));
  auVar28 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar12),ZEXT416((uint)cVar15));
  cVar16 = (pcVar18->m_basis).m_el[2].m_floats[0];
  cVar17 = (pcVar18->m_basis).m_el[2].m_floats[1];
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)cVar17));
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar16),ZEXT416((uint)cVar4));
  cVar4 = (pcVar18->m_basis).m_el[2].m_floats[2];
  auVar22 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar4),ZEXT416((uint)cVar6));
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)cVar17));
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar16),ZEXT416((uint)cVar5));
  auVar23 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar4),ZEXT416((uint)cVar9));
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)cVar17));
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar16),ZEXT416((uint)cVar10));
  auVar24 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar4),ZEXT416((uint)cVar12));
  cVar5 = (childTrans->m_origin).m_floats[0];
  fVar1 = (childTrans->m_origin).m_floats[1];
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar3)),ZEXT416((uint)cVar5),ZEXT416((uint)cVar2)
                           );
  cVar2 = (childTrans->m_origin).m_floats[2];
  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar2),ZEXT416((uint)cVar7));
  auVar29 = vmulss_avx512f(ZEXT416((uint)cVar14),ZEXT416((uint)fVar1));
  auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)cVar5),ZEXT416((uint)cVar13));
  auVar30 = vfmadd231ss_avx512f(auVar29,ZEXT416((uint)cVar2),ZEXT416((uint)cVar15));
  auVar29 = vmulss_avx512f(ZEXT416((uint)cVar17),ZEXT416((uint)fVar1));
  auVar29 = vfmadd231ss_avx512f(auVar29,ZEXT416((uint)cVar5),ZEXT416((uint)cVar16));
  auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)cVar2),ZEXT416((uint)cVar4));
  auVar25 = vinsertps_avx(ZEXT416((uint)(auVar25._0_4_ + (pcVar18->m_origin).m_floats[0])),
                          ZEXT416((uint)(auVar30._0_4_ + (pcVar18->m_origin).m_floats[1])),0x10);
  local_40.m_origin.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar25,ZEXT416((uint)(auVar29._0_4_ + (pcVar18->m_origin).m_floats[2])),0x28);
  local_90.m_worldTransform = &local_40;
  local_40.m_basis.m_el[0].m_floats[0] = auVar19._0_4_;
  local_40.m_basis.m_el[0].m_floats[1] = auVar20._0_4_;
  local_40.m_basis.m_el[0].m_floats[2] = auVar21._0_4_;
  local_40.m_basis.m_el[0].m_floats[3] = 0.0;
  local_40.m_basis.m_el[1].m_floats[0] = auVar26._0_4_;
  local_40.m_basis.m_el[1].m_floats[1] = auVar27._0_4_;
  local_40.m_basis.m_el[1].m_floats[2] = auVar28._0_4_;
  local_40.m_basis.m_el[1].m_floats[3] = 0.0;
  local_40.m_basis.m_el[2].m_floats[0] = auVar22._0_4_;
  local_40.m_basis.m_el[2].m_floats[1] = auVar23._0_4_;
  local_40.m_basis.m_el[2].m_floats[2] = auVar24._0_4_;
  local_40.m_basis.m_el[2].m_floats[3] = 0.0;
  local_50 = this->m_resultCallback;
  local_68.m_collisionFilterMask = -1;
  local_68._vptr_ConvexResultCallback = (_func_int **)&PTR__ConvexResultCallback_00b6ff68;
  local_68.m_collisionFilterGroup = 1;
  local_68.m_closestHitFraction = local_50->m_closestHitFraction;
  local_90.m_parent = this->m_colObjWrap;
  local_90.m_collisionObject = (local_90.m_parent)->m_collisionObject;
  local_90.m_partId = -1;
  local_90.m_shape = childCollisionShape;
  local_90.m_index = index;
  local_48 = index;
  objectQuerySingleInternal
            (this->m_castShape,this->m_convexFromTrans,this->m_convexToTrans,&local_90,&local_68,
             this->m_allowedPenetration);
  return;
}

Assistant:

void ProcessChild(int index, const cbtTransform& childTrans, const cbtCollisionShape* childCollisionShape)
					{
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						struct LocalInfoAdder : public ConvexResultCallback
						{
							ConvexResultCallback* m_userCallback;
							int m_i;

							LocalInfoAdder(int i, ConvexResultCallback* user)
								: m_userCallback(user), m_i(i)
							{
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
							}
							virtual bool needsCollision(cbtBroadphaseProxy* p) const
							{
								return m_userCallback->needsCollision(p);
							}
							virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalConvexResult& r, bool b)
							{
								cbtCollisionWorld::LocalShapeInfo shapeInfo;
								shapeInfo.m_shapePart = -1;
								shapeInfo.m_triangleIndex = m_i;
								if (r.m_localShapeInfo == NULL)
									r.m_localShapeInfo = &shapeInfo;
								const cbtScalar result = m_userCallback->addSingleResult(r, b);
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
								return result;
							}
						};

						LocalInfoAdder my_cb(index, &m_resultCallback);

						cbtCollisionObjectWrapper tmpObj(m_colObjWrap, childCollisionShape, m_colObjWrap->getCollisionObject(), childWorldTrans, -1, index);

						objectQuerySingleInternal(m_castShape, m_convexFromTrans, m_convexToTrans, &tmpObj, my_cb, m_allowedPenetration);
					}